

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Symbol.hh
# Opt level: O2

void avro::parsing::SimpleParser<avro::parsing::JsonHandler>::throwMismatch
               (Kind expected,Kind actual)

{
  ostream *poVar1;
  Exception *this;
  string local_1b0;
  ostringstream oss;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
  poVar1 = std::operator<<((ostream *)&oss,"Invalid operation. Expected: ");
  poVar1 = std::operator<<(poVar1,*(char **)(Symbol::stringValues + (ulong)expected * 8));
  poVar1 = std::operator<<(poVar1," got ");
  std::operator<<(poVar1,*(char **)(Symbol::stringValues + (ulong)actual * 8));
  this = (Exception *)__cxa_allocate_exception(0x18);
  std::__cxx11::stringbuf::str();
  Exception::Exception(this,&local_1b0);
  __cxa_throw(this,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

static void throwMismatch(Symbol::Kind expected, Symbol::Kind actual)
    {
        std::ostringstream oss;
        oss << "Invalid operation. Expected: " <<
            Symbol::toString(expected) << " got " <<
            Symbol::toString(actual);
        throw Exception(oss.str());
    }